

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  byte bVar1;
  undefined1 local_148 [8];
  AssertionResult result;
  string actualMessage;
  undefined1 local_60 [8];
  AssertionResultData data;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher_local;
  ResultBuilder *this_local;
  
  data._64_8_ = matcher;
  if (((this->m_exprComponents).testFalse & 1U) == 0) {
    AssertionResultData::AssertionResultData((AssertionResultData *)local_60,&this->m_data);
    data.message.field_2._8_4_ = 0;
    std::__cxx11::string::operator=
              ((string *)local_60,(string *)&(this->m_assertionInfo).capturedExpression);
    translateActiveException_abi_cxx11_();
    bVar1 = (**(code **)(*(long *)data._64_8_ + 0x28))(data._64_8_,&result.m_resultData.resultType);
    if ((bVar1 & 1) == 0) {
      data.message.field_2._8_4_ = 0x11;
      std::__cxx11::string::operator=((string *)local_60,(string *)&result.m_resultData.resultType);
    }
    AssertionResult::AssertionResult
              ((AssertionResult *)local_148,&this->m_assertionInfo,(AssertionResultData *)local_60);
    handleResult(this,(AssertionResult *)local_148);
    AssertionResult::~AssertionResult((AssertionResult *)local_148);
    std::__cxx11::string::~string((string *)&result.m_resultData.resultType);
    AssertionResultData::~AssertionResultData((AssertionResultData *)local_60);
    return;
  }
  __assert_fail("m_exprComponents.testFalse == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/technitute[P]AttitudeMathLibrary/test/catch/catch.hpp"
                ,0x205a,
                "void Catch::ResultBuilder::captureExpectedException(const Matchers::Impl::Matcher<std::string> &)"
               );
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }